

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessian.cpp
# Opt level: O0

double __thiscall
HighsHessian::objectiveValue(HighsHessian *this,vector<double,_std::allocator<double>_> *solution)

{
  double dVar1;
  double dVar2;
  int iVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  vector<double,_std::allocator<double>_> *in_RSI;
  int *in_RDI;
  HighsInt iEl_1;
  HighsInt iEl;
  HighsInt iCol;
  double objective_function_value;
  int local_24;
  int local_1c;
  double local_18;
  
  local_18 = 0.0;
  for (local_1c = 0; local_1c < *in_RDI; local_1c = local_1c + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_1c);
    iVar3 = *pvVar4;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_1c);
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),(long)iVar3);
    dVar2 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_1c);
    local_18 = dVar1 * 0.5 * dVar2 * *pvVar5 + local_18;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_1c);
    local_24 = *pvVar4;
    while( true ) {
      local_24 = local_24 + 1;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)(local_1c + 1));
      if (*pvVar4 <= local_24) break;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_1c);
      dVar1 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),(long)local_24);
      dVar2 = *pvVar5;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_24);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)*pvVar4);
      local_18 = dVar1 * dVar2 * *pvVar5 + local_18;
    }
  }
  return local_18;
}

Assistant:

double HighsHessian::objectiveValue(const std::vector<double>& solution) const {
  double objective_function_value = 0;
  for (HighsInt iCol = 0; iCol < this->dim_; iCol++) {
    HighsInt iEl = this->start_[iCol];
    assert(this->index_[iEl] == iCol);
    objective_function_value +=
        0.5 * solution[iCol] * this->value_[iEl] * solution[iCol];
    for (HighsInt iEl = this->start_[iCol] + 1; iEl < this->start_[iCol + 1];
         iEl++)
      objective_function_value +=
          solution[iCol] * this->value_[iEl] * solution[this->index_[iEl]];
  }
  return objective_function_value;
}